

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffc_dh.c
# Opt level: O0

DH_NAMED_GROUP * ossl_ffc_numbers_to_dh_named_group(BIGNUM *p,BIGNUM *q,BIGNUM *g)

{
  int iVar1;
  BIGNUM *in_RDX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  size_t i;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (0xd < local_28) {
      return (DH_NAMED_GROUP *)0x0;
    }
    iVar1 = BN_cmp(in_RDI,(BIGNUM *)dh_named_groups[local_28].p);
    if (((iVar1 == 0) && (iVar1 = BN_cmp(in_RDX,(BIGNUM *)dh_named_groups[local_28].g), iVar1 == 0))
       && ((in_RSI == (BIGNUM *)0x0 ||
           (iVar1 = BN_cmp(in_RSI,(BIGNUM *)dh_named_groups[local_28].q), iVar1 == 0)))) break;
    local_28 = local_28 + 1;
  }
  return dh_named_groups + local_28;
}

Assistant:

const DH_NAMED_GROUP *ossl_ffc_numbers_to_dh_named_group(const BIGNUM *p,
                                                         const BIGNUM *q,
                                                         const BIGNUM *g)
{
    size_t i;

    for (i = 0; i < OSSL_NELEM(dh_named_groups); ++i) {
        /* Keep searching until a matching p and g is found */
        if (BN_cmp(p, dh_named_groups[i].p) == 0
            && BN_cmp(g, dh_named_groups[i].g) == 0
            /* Verify q is correct if it exists */
            && (q == NULL || BN_cmp(q, dh_named_groups[i].q) == 0))
            return &dh_named_groups[i];
    }
    return NULL;
}